

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

void __thiscall
particleSamples::filter_particles
          (particleSamples *this,int PoI_monval,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *full_list,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *filted_list)

{
  pointer ppvVar1;
  pointer paVar2;
  bool bVar3;
  long lVar4;
  anon_struct_120_15_f999644b *part_i;
  pointer __x;
  pointer ppvVar5;
  vector<particle_info,_std::allocator<particle_info>_> *local_38;
  
  clear_out_previous_record(this,filted_list);
  ppvVar1 = (full_list->
            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = 0;
  for (ppvVar5 = (full_list->
                 super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppvVar5 != ppvVar1;
      ppvVar5 = ppvVar5 + 1) {
    local_38 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
    (local_38->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_38->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_38->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
    ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>
              ((vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                *)filted_list,&local_38);
    paVar2 = ((*ppvVar5)->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    for (__x = ((*ppvVar5)->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
               _M_impl.super__Vector_impl_data._M_start; __x != paVar2; __x = __x + 1) {
      bVar3 = decide_to_pick_OSCAR(this,PoI_monval,__x->monval);
      if (bVar3) {
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((filted_list->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar4],__x);
      }
    }
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

void particleSamples::filter_particles(
    const int PoI_monval, vector<vector<particle_info> *> *full_list,
    vector<vector<particle_info> *> *filted_list) {
    // clean out the previous record
    clear_out_previous_record(filted_list);

    int i = 0;
    for (auto &ev_i : (*full_list)) {
        filted_list->push_back(new vector<particle_info>);
        for (auto &part_i : (*ev_i)) {
            bool pick_flag = decide_to_pick_OSCAR(PoI_monval, part_i.monval);
            if (pick_flag) {
                (*filted_list)[i]->push_back(part_i);
            }
        }
        i++;
    }
}